

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ParserResult *
Catch::Clara::Detail::convertInto<long>
          (ParserResult *__return_storage_ptr__,string *source,long *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  ulong *puVar4;
  ulong *puVar5;
  stringstream ss;
  ulong local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [4];
  byte abStack_188 [96];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8,(string *)source,_S_out|_S_in);
  std::istream::_M_extract<long>(local_1a8);
  if ((abStack_188[*(long *)(local_1a8[0] + -0x18)] & 5) == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(&local_1c8,"Unable to convert \'",source);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_1d8 = *puVar5;
      lStack_1d0 = plVar3[3];
      puVar4 = &local_1d8;
    }
    else {
      local_1d8 = *puVar5;
      puVar4 = (ulong *)*plVar3;
    }
    sVar2 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (puVar4 == &local_1d8) {
      paVar1->_M_allocated_capacity = local_1d8;
      *(long *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = lStack_1d0;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)puVar4;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_1d8;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
    local_1d8 = local_1d8 & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source, T& target ) {
                std::stringstream ss( source );
                ss >> target;
                if ( ss.fail() ) {
                    return ParserResult::runtimeError(
                        "Unable to convert '" + source +
                        "' to destination type" );
                } else {
                    return ParserResult::ok( ParseResultType::Matched );
                }
            }